

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

_Bool ends_with(char *str,char *suffix)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  _Bool _Var3;
  
  if (suffix == (char *)0x0 || str == (char *)0x0) {
    return false;
  }
  sVar2 = strlen(str);
  __n = strlen(suffix);
  if (sVar2 < __n) {
    _Var3 = false;
  }
  else {
    iVar1 = strncmp(str + (sVar2 - __n),suffix,__n);
    _Var3 = iVar1 == 0;
  }
  return _Var3;
}

Assistant:

bool
ends_with (const char *str, const char *suffix)
{
  size_t str_len;
  size_t suffix_len;

  if (unlikely (str == NULL || suffix == NULL))
    return false;

  str_len = strlen (str);
  suffix_len = strlen (suffix);

  if (suffix_len > str_len)
    return false;

  return !strncmp (str + str_len - suffix_len,
                  suffix, suffix_len);
}